

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask1_8(uint32_t *in,uint32_t *out)

{
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 1 | *out;
  *out = in[2] << 2 | *out;
  *out = in[3] << 3 | *out;
  *out = in[4] << 4 | *out;
  *out = in[5] << 5 | *out;
  *out = in[6] << 6 | *out;
  *out = in[7] << 7 | *out;
  return out + 1;
}

Assistant:

uint32_t *__fastpackwithoutmask1_8(const uint32_t *__restrict__ in,
                                   uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 7;
  ++in;

  return out + 1;
}